

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_synthesis.c
# Opt level: O0

void init_scaling_function(int (*scaling_points) [2],int num_points,int *scaling_lut)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int i_1;
  int x;
  int64_t delta;
  int delta_x;
  int delta_y;
  int point;
  int i;
  int *scaling_lut_local;
  int num_points_local;
  int (*scaling_points_local) [2];
  
  if (num_points != 0) {
    for (i = 0; i < (*scaling_points)[0]; i = i + 1) {
      scaling_lut[i] = (*scaling_points)[1];
    }
    for (point = 0; point < num_points + -1; point = point + 1) {
      iVar1 = scaling_points[point + 1][1];
      iVar2 = scaling_points[point][1];
      iVar3 = scaling_points[point + 1][0] - scaling_points[point][0];
      for (x = 0; x < iVar3; x = x + 1) {
        scaling_lut[scaling_points[point][0] + x] =
             scaling_points[point][1] +
             (int)((ulong)((long)x * (long)((iVar1 - iVar2) * (((iVar3 >> 1) + 0x10000) / iVar3)) +
                          0x8000) >> 0x10);
      }
    }
    for (i_1 = scaling_points[num_points + -1][0]; i_1 < 0x100; i_1 = i_1 + 1) {
      scaling_lut[i_1] = scaling_points[num_points + -1][1];
    }
  }
  return;
}

Assistant:

static void init_scaling_function(const int scaling_points[][2], int num_points,
                                  int scaling_lut[]) {
  if (num_points == 0) return;

  for (int i = 0; i < scaling_points[0][0]; i++)
    scaling_lut[i] = scaling_points[0][1];

  for (int point = 0; point < num_points - 1; point++) {
    int delta_y = scaling_points[point + 1][1] - scaling_points[point][1];
    int delta_x = scaling_points[point + 1][0] - scaling_points[point][0];

    int64_t delta = delta_y * ((65536 + (delta_x >> 1)) / delta_x);

    for (int x = 0; x < delta_x; x++) {
      scaling_lut[scaling_points[point][0] + x] =
          scaling_points[point][1] + (int)((x * delta + 32768) >> 16);
    }
  }

  for (int i = scaling_points[num_points - 1][0]; i < 256; i++)
    scaling_lut[i] = scaling_points[num_points - 1][1];
}